

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data2pvd.cpp
# Opt level: O1

int transformMercuryToVTK<2ul>(MercuryDataFile *infile,string *prefix)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  type pVVar6;
  ostream *poVar7;
  long lVar8;
  size_t timestepCount;
  string strippedPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  VTKPointDescriptor<MercuryParticle<2UL>_> descriptor;
  MercuryTimeStepIterator<2UL> __end0;
  MercuryTimeStepIterator<2UL> __begin0;
  VTKUnstructuredGrid<MercuryParticle<2UL>_> timeStepFile;
  ostringstream filename;
  VTKCollection collection;
  long local_898;
  undefined1 *local_890;
  long local_888;
  undefined1 local_880 [16];
  undefined8 local_870;
  string local_868;
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  string local_828;
  string local_808;
  VTKPointDescriptor<MercuryParticle<2UL>_> local_7e8;
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_> vStack_6c8;
  char local_6b0;
  undefined7 uStack_6af;
  undefined8 uStack_6a8;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_> local_658;
  undefined8 local_640;
  undefined8 uStack_638;
  MercuryTimeStepIterator<2UL> local_628;
  VTKPointDescriptor<MercuryParticle<2UL>_> *local_5c0;
  long local_5b8;
  filebuf local_5b0 [24];
  int aiStack_598 [54];
  ios_base local_4c0 [264];
  ostringstream local_3b8 [112];
  ios_base local_348 [264];
  VTKCollection local_240;
  
  local_7e8.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7e8.positionEntry_ = (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)0x0;
  local_7e8.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"Position","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (&local_7e8,&local_808,0,true);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"Velocity","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar6,&local_748,0x18,false);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"Rotation","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar6,&local_768,0x30,false);
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"AngVelocity","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar6,&local_828,0x48,false);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"Radius","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double>
                     (pVVar6,&local_788,0x60,false);
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Species","");
  VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<unsigned_long>
            (pVVar6,&local_7a8,0x68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_848,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)local_848);
  std::ofstream::ofstream(&local_240,(string *)local_848,_S_out);
  local_240.hasHeader_ = false;
  local_240.hasFooter_ = false;
  local_240.recordID_ = 0;
  if (local_848[0] != local_838) {
    operator_delete(local_848[0]);
  }
  if (*(int *)(&local_240.field_0x20 + *(long *)(local_240._0_8_ + -0x18)) != 0) {
    std::enable_if<!((((Log)((signed_char)0))<((Log)-20))||(((Log)0)<((Log)-20))),void>::
    type_Logger<(Log)0>::operator()
              ((type_Logger<(Log)0> *)&logger,
               "Could not open \'%.pvd\' for output.\nPlease make sure you have the appropriate permissions and try again."
               ,prefix);
  }
  local_898 = 0;
  std::istream::seekg(infile,0,0);
  MercuryTimeStepIterator<2UL>::MercuryTimeStepIterator(&local_628,infile);
  lVar3 = _VTT;
  local_708 = 0;
  uStack_700 = 0;
  local_6f8 = 0;
  local_6d0 = 0;
  vStack_6c8.super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_6c8.super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_6c8.super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b0 = '\x01';
  iVar5 = 0;
  uStack_6a8 = 0;
  local_870 = __filebuf;
  while( true ) {
    local_668 = uStack_6d8;
    uStack_660 = local_6d0;
    local_678 = local_6e8;
    uStack_670 = uStack_6e0;
    local_688 = local_6f8;
    uStack_680 = uStack_6f0;
    local_698 = local_708;
    uStack_690 = uStack_700;
    std::vector<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>::vector
              (&local_658,&vStack_6c8);
    bVar2 = local_628.isEOFTimeStep_;
    cVar4 = local_6b0;
    local_640 = CONCAT71(uStack_6af,local_6b0);
    uStack_638 = uStack_6a8;
    if (local_658.super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_658.
                      super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar2 == (bool)cVar4) break;
    std::__cxx11::ostringstream::ostringstream(local_3b8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    local_5c0 = (VTKPointDescriptor<MercuryParticle<2UL>_> *)CONCAT71(local_5c0._1_7_,0x5f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_5c0,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".vtu",4);
    std::__cxx11::stringbuf::str();
    local_5c0 = &local_7e8;
    std::ofstream::ofstream(&local_5b8,(string *)local_7c8,_S_out);
    if (local_7c8[0] != local_7b8) {
      operator_delete(local_7c8[0]);
    }
    if (*(int *)((long)aiStack_598 + *(long *)(local_5b8 + -0x18)) == 0) {
      if (*(int *)(&infile->field_0x20 + *(long *)(*(long *)infile + -0x18)) != 0) {
        std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
        type_Logger<(Log)0>::operator()
                  ((type_Logger<(Log)0> *)&logger,
                   "An IOError occurred during the reading of the input file.\nPlease make sure you are feeding this tool mercury data files."
                  );
        iVar5 = 5;
        goto LAB_00108c6a;
      }
      VTKUnstructuredGrid<MercuryParticle<2ul>>::write<MercuryTimeStep<2ul>>
                ((VTKUnstructuredGrid<MercuryParticle<2ul>> *)&local_5c0,
                 &local_628.lastReadTimeStep_);
      std::__cxx11::stringbuf::str();
      lVar8 = std::__cxx11::string::rfind((char)(string *)&local_890,0x2f);
      if (lVar8 != -1) {
        std::__cxx11::string::substr((ulong)local_728,(ulong)&local_890);
        std::__cxx11::string::operator=((string *)&local_890,(string *)local_728);
        if (local_728[0] != local_718) {
          operator_delete(local_728[0]);
        }
      }
      local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_868,local_890,local_890 + local_888);
      VTKCollection::append(&local_240,&local_868);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p);
      }
      local_898 = local_898 + 1;
      if (local_890 != local_880) {
        operator_delete(local_890);
      }
      bVar2 = true;
    }
    else {
      std::__cxx11::stringbuf::str();
      std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
      type_Logger<(Log)0>::operator()
                ((type_Logger<(Log)0> *)&logger,
                 "Could not open \'%\' for output.\nPlease make sure you have the appropriate permissions and try again."
                 ,(string *)&local_890);
      if (local_890 != local_880) {
        operator_delete(local_890);
      }
      iVar5 = 6;
LAB_00108c6a:
      bVar2 = false;
    }
    local_5b8 = lVar3;
    *(undefined8 *)(local_5b0 + *(long *)(lVar3 + -0x18) + -8) = local_870;
    std::filebuf::~filebuf(local_5b0);
    std::ios_base::~ios_base(local_4c0);
    std::__cxx11::ostringstream::~ostringstream(local_3b8);
    std::ios_base::~ios_base(local_348);
    if (!bVar2) break;
    MercuryTimeStepIterator<2UL>::operator++(&local_628);
  }
  if (vStack_6c8.super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_6c8.
                    super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_628.lastReadTimeStep_.storage_.
      super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_628.lastReadTimeStep_.storage_.
                    super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5c0 = (VTKPointDescriptor<MercuryParticle<2UL>_> *)0x2;
  std::enable_if<!((((Log)((signed_char)0))<((Log)-5))||(((Log)0)<((Log)-5))),void>::
  type_Logger<(Log)0>::operator()
            ((type_Logger<(Log)0> *)&logger,"Written % timesteps in a %D system.",&local_898);
  VTKCollection::~VTKCollection(&local_240);
  VTKPointDescriptor<MercuryParticle<2UL>_>::~VTKPointDescriptor(&local_7e8);
  return iVar5;
}

Assistant:

int transformMercuryToVTK(MercuryDataFile& infile, std::string prefix)
{
  //We really want to describe our exit code.
  int exitCode = 0;
  
  //We'll set up a descriptor.
  //Let the compiler figure out what the types / dimensions are, that's too
  //much work anyway. Oh and make sure position is used as both a datafield
  //and the actual position of the object.
  VTKPointDescriptor< MercuryParticle<NDIMS> > descriptor;
  descriptor
    .addProperty( "Position",    & MercuryParticle< NDIMS >::position , true)
    .addProperty( "Velocity",    & MercuryParticle< NDIMS >::velocity  )
    .addProperty( "Rotation",    & MercuryParticle< NDIMS >::rotation  )
    .addProperty( "AngVelocity", & MercuryParticle< NDIMS >::angularV  )
    .addProperty( "Radius",      & MercuryParticle< NDIMS >::radius    )
    .addProperty( "Species",     & MercuryParticle< NDIMS >::speciesID );
    
  // We want a Collection file which lists all individual files
  VTKCollection collection( prefix + ".pvd" );
  // First, make sure it is sane.
  if (!collection)
    logger( FATAL, "Could not open '%.pvd' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", prefix);
  
  std::size_t timestepCount = 0;
  
  //Now, read all the timesteps as if they were NDIMS long.
  for (const MercuryTimeStep<NDIMS> & ts : infile.as<NDIMS>())
  {
    //Generate the filename for the individual data files.
    std::ostringstream filename;
    filename << prefix << '_' << ts.getTimeStepID() << ".vtu";
    
    //We'll set up a datafile containing the individual timestep.
    VTKUnstructuredGrid< MercuryParticle<NDIMS> > timeStepFile(filename.str(), &descriptor);
    if (!timeStepFile) //but not after we've done some sanity checking!
    {
      logger(WARN, "Could not open '%' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", filename.str());
      exitCode = 6;
      break;
    }
    
    if (!infile) //Some sanity checking? More sanity checking! ALL the sanity checking!!!
    {
      logger(WARN, "An IOError occurred during the reading of the input file.\n"
                   "Please make sure you are feeding this tool mercury data files.");
      exitCode = 5; 
      break;
    }
    //Okay. we done.
    //Let's write.
    timeStepFile.write(ts);
    
    //So, a user may give an output path which is in a different directory. 
    // However, since the index files resides in the same output directory
    // as the timestep files, we need to specify relative paths.
    std::string strippedPath = filename.str();
    //so, we try to find the last / - because to hell with everybody with other
    //path seperators...
    std::string::size_type slashPosition = strippedPath.rfind('/');
    //and take only the last part. It's not the last character, trust me.
    //we checked for that in main().
    if (slashPosition != std::string::npos)
      strippedPath = strippedPath.substr(slashPosition + 1);
    //And now put the relative path in the listing file
    collection.append(strippedPath);
    
    timestepCount++;
  }
  
  logger(INFO, "Written % timesteps in a %D system.", timestepCount, NDIMS);
  
  return exitCode;
}